

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

LPCWSTR __thiscall Js::RecyclableObjectDisplay::Value(RecyclableObjectDisplay *this,int radix)

{
  Type TVar1;
  JavascriptLibrary *pJVar2;
  StringBuilder<Memory::ArenaAllocator> *this_00;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  StaticType *type;
  JavascriptString *pJVar8;
  JavascriptString *pstRight;
  RecyclableObject *pRVar9;
  JavascriptTypedNumber<long> *pJVar10;
  undefined4 extraout_var;
  char16 *pcVar11;
  JavascriptTypedNumber<unsigned_long> *pJVar12;
  JavascriptNumberObject *this_01;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  char *pcVar16;
  Var pvVar17;
  double value;
  undefined1 auVar18 [16];
  
  pvVar17 = this->instance;
  if (((ulong)pvVar17 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar17 >> 0x32 == 0 && ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) &&
       (bVar4 = VarIs<Js::JavascriptNumberObject>(pvVar17), !bVar4)) {
      pvVar17 = this->instance;
      if (pvVar17 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
LAB_008b2be4:
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar17);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008b308a;
          *puVar7 = 0;
        }
        TVar1 = ((pRVar9->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Int64Number) goto LAB_008b275c;
        }
        else {
          BVar6 = RecyclableObject::IsExternal(pRVar9);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            pcVar16 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            pcVar14 = "(typeId < TypeIds_Limit || obj->IsExternal())";
            pcVar13 = "GetTypeId aValue has invalid TypeId";
            uVar15 = 0xe;
            goto LAB_008b2cb0;
          }
        }
      }
      else if (((ulong)pvVar17 & 0x1ffff00000000) == 0x1000000000000 ||
               ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
        if (pvVar17 < (Var)0x4000000000000 &&
            ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) goto LAB_008b2be4;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar14 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar13 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar15 = 0x2a;
LAB_008b2cb0:
        bVar4 = Throw::ReportAssert(pcVar16,uVar15,pcVar14,pcVar13);
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
      }
      pvVar17 = this->instance;
      if (pvVar17 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
LAB_008b2dac:
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar17);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008b308a;
          *puVar7 = 0;
        }
        TVar1 = ((pRVar9->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 != TypeIds_LastNumberType) goto LAB_008b2eea;
          goto LAB_008b275c;
        }
        BVar6 = RecyclableObject::IsExternal(pRVar9);
        if (BVar6 != 0) goto LAB_008b2eea;
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar14 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar13 = "GetTypeId aValue has invalid TypeId";
        uVar15 = 0xe;
      }
      else {
        if (((ulong)pvVar17 & 0x1ffff00000000) == 0x1000000000000 ||
            ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
          if ((Var)0x3ffffffffffff < pvVar17 ||
              ((ulong)pvVar17 & 0xffff000000000000) == 0x1000000000000) goto LAB_008b2eea;
          goto LAB_008b2dac;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar14 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar13 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar15 = 0x2a;
      }
      bVar4 = Throw::ReportAssert(pcVar16,uVar15,pcVar14,pcVar13);
      if (bVar4) {
        *puVar7 = 0;
LAB_008b2eea:
        pRVar9 = VarTo<Js::RecyclableObject>(this->instance);
        this_00 = this->scriptContext->threadContext->debugManager->pCurrentInterpreterLocation->
                  stringBuilder;
        this_00->length = 0;
        this_00->count = 0;
        this_00->lastChunk = (Data *)0x0;
        this_00->firstChunk = (Data *)0x0;
        this_00->secondChunk = (Data *)0x0;
        iVar5 = (*(pRVar9->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x50])(pRVar9,this_00,this->scriptContext);
        if (iVar5 == 0) {
          return L"undefined";
        }
        pcVar11 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
        return pcVar11;
      }
      goto LAB_008b308a;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008b308a;
    *puVar7 = 0;
  }
LAB_008b275c:
  pvVar17 = this->instance;
  if (((ulong)pvVar17 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar17 >> 0x32 != 0) {
        value = (double)((ulong)pvVar17 ^ 0xfffc000000000000);
        goto LAB_008b27e8;
      }
      if (pvVar17 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
      }
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar17);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
      }
      TVar1 = ((pRVar9->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Int64Number) {
          pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(this->instance);
          value = (double)pJVar10->m_value;
          goto LAB_008b27e8;
        }
      }
      else {
        BVar6 = RecyclableObject::IsExternal(pRVar9);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_008b308a;
          *puVar7 = 0;
        }
      }
      pvVar17 = this->instance;
      if (pvVar17 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_008b308a;
        *puVar7 = 0;
LAB_008b2f77:
        pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar17);
        if (pRVar9 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_008b308a;
          *puVar7 = 0;
        }
        TVar1 = ((pRVar9->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_LastNumberType) {
            pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(this->instance);
            auVar18._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar12->m_value);
            auVar18._8_4_ = (int)(pJVar12->m_value >> 0x20);
            auVar18._12_4_ = 0x45300000;
            value = (auVar18._0_8_ - 4503599627370496.0) + (auVar18._8_8_ - 1.9342813113834067e+25);
            goto LAB_008b27e8;
          }
        }
        else {
          BVar6 = RecyclableObject::IsExternal(pRVar9);
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar7 = 1;
            pcVar16 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            pcVar14 = "(typeId < TypeIds_Limit || obj->IsExternal())";
            pcVar13 = "GetTypeId aValue has invalid TypeId";
            uVar15 = 0xe;
            goto LAB_008b3064;
          }
        }
      }
      else if (((ulong)pvVar17 & 0x1ffff00000000) == 0x1000000000000 ||
               ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) {
        if (pvVar17 < (Var)0x4000000000000 &&
            ((ulong)pvVar17 & 0xffff000000000000) != 0x1000000000000) goto LAB_008b2f77;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar16 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar14 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar13 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar15 = 0x2a;
LAB_008b3064:
        bVar4 = Throw::ReportAssert(pcVar16,uVar15,pcVar14,pcVar13);
        if (!bVar4) {
LAB_008b308a:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      this_01 = VarTo<Js::JavascriptNumberObject>(this->instance);
      value = JavascriptNumberObject::GetValue(this_01);
      goto LAB_008b27e8;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_008b308a;
    *puVar7 = 0;
    pvVar17 = this->instance;
  }
  value = (double)(int)pvVar17;
LAB_008b27e8:
  if (((radix == 10) || (value != (double)(int)value)) || (NAN(value) || NAN((double)(int)value))) {
    bVar4 = NumberUtilities::IsSpecial(value,0x8000000000000000);
    if (bVar4) {
      return L"-0";
    }
    pJVar8 = JavascriptNumber::ToStringRadix10(value,this->scriptContext);
  }
  else {
    if (0x22 < radix - 2U) {
      return L"";
    }
    if (radix == 0x10) {
      pJVar2 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
      type = StringCache::GetStringTypeStatic(&pJVar2->stringCache);
      pJVar8 = &LiteralString::New(type,L"0x",2,pJVar2->recycler)->super_JavascriptString;
      pstRight = JavascriptNumber::ToStringRadixHelper
                           ((double)(-(ulong)(value < 0.0) & (ulong)(double)(uint)(int)value |
                                    ~-(ulong)(value < 0.0) & (ulong)value),0x10,this->scriptContext)
      ;
      pJVar8 = JavascriptString::Concat(pJVar8,pstRight);
    }
    else {
      pJVar8 = JavascriptNumber::ToStringRadixHelper(value,radix,this->scriptContext);
    }
  }
  iVar5 = (*(pJVar8->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar8);
  return (LPCWSTR)CONCAT44(extraout_var,iVar5);
}

Assistant:

LPCWSTR RecyclableObjectDisplay::Value(int radix)
    {
        LPCWSTR valueStr = _u("");

        if(Js::TaggedInt::Is(instance)
            || Js::JavascriptNumber::Is(instance)
            || Js::VarIs<Js::JavascriptNumberObject>(instance)
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number
            || Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
        {
            double value;
            if (Js::TaggedInt::Is(instance))
            {
                value = TaggedInt::ToDouble(instance);
            }
            else if (Js::JavascriptNumber::Is(instance))
            {
                value = Js::JavascriptNumber::GetValue(instance);
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_Int64Number)
            {
                value = (double)VarTo<JavascriptInt64Number>(instance)->GetValue();
            }
            else if (Js::JavascriptOperators::GetTypeId(instance) == TypeIds_UInt64Number)
            {
                value = (double)VarTo<JavascriptUInt64Number>(instance)->GetValue();
            }
            else
            {
                Js::JavascriptNumberObject* numobj = Js::VarTo<Js::JavascriptNumberObject>(instance);
                value = numobj->GetValue();
            }

            // For fractional values, radix is ignored.
            int32 l = (int32)value;
            bool isZero = JavascriptNumber::IsZero(value - (double)l);

            if (radix == 10 || !isZero)
            {
                if (Js::JavascriptNumber::IsNegZero(value))
                {
                    // In debugger, we wanted to show negative zero explicitly
                    valueStr = _u("-0");
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadix10(value, scriptContext)->GetSz();
                }
            }
            else if (radix >= 2 && radix <= 36)
            {
                if (radix == 16)
                {
                    if (value < 0)
                    {
                        // On the tools side we show unsigned value.
                        uint32 ul = static_cast<uint32>(static_cast<int32>(value)); // ARM: casting negative value to uint32 gives 0
                        value = (double)ul;
                    }
                    valueStr = Js::JavascriptString::Concat(scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("0x")),
                                                            Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext))->GetSz();
                }
                else
                {
                    valueStr = Js::JavascriptNumber::ToStringRadixHelper(value, radix, scriptContext)->GetSz();
                }
            }
        }
        else
        {
            Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(instance);

            StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
            builder->Reset();

            if (obj->GetDiagValueString(builder, scriptContext))
            {
                valueStr = builder->Detach();
            }
            else
            {
                valueStr = _u("undefined");
            }
        }

        return valueStr;
    }